

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O2

TypeInfo * readTypeInfo(TypeInfo *__return_storage_ptr__,XMLElement *element)

{
  XMLNode *pXVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  undefined4 extraout_var_00;
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38;
  
  TypeInfo::TypeInfo(__return_storage_ptr__);
  pXVar1 = (element->super_XMLNode)._prev;
  if (pXVar1 != (XMLNode *)0x0) {
    iVar2 = (*pXVar1->_vptr_XMLNode[7])(pXVar1);
    if (CONCAT44(extraout_var,iVar2) != 0) {
      pcVar3 = tinyxml2::XMLNode::Value(pXVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,pcVar3,(allocator<char> *)&local_58);
      trim(&local_38,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&__return_storage_ptr__->prefix,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  pcVar3 = tinyxml2::XMLElement::GetText(element);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&__return_storage_ptr__->type,pcVar3);
  pXVar1 = (element->super_XMLNode)._next;
  if (pXVar1 != (XMLNode *)0x0) {
    iVar2 = (*pXVar1->_vptr_XMLNode[7])(pXVar1);
    if (CONCAT44(extraout_var_00,iVar2) != 0) {
      pcVar3 = tinyxml2::XMLNode::Value(pXVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar3,&local_79);
      trimEnd(&local_78,&local_58);
      trimStars(&local_38,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&__return_storage_ptr__->postfix,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline TypeInfo readTypeInfo( tinyxml2::XMLElement const * element )
{
  TypeInfo                  typeInfo;
  tinyxml2::XMLNode const * previousSibling = element->PreviousSibling();
  if ( previousSibling && previousSibling->ToText() )
  {
    typeInfo.prefix = trim( previousSibling->Value() );
  }
  typeInfo.type                         = element->GetText();
  tinyxml2::XMLNode const * nextSibling = element->NextSibling();
  if ( nextSibling && nextSibling->ToText() )
  {
    typeInfo.postfix = trimStars( trimEnd( nextSibling->Value() ) );
  }
  return typeInfo;
}